

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGenericHandler.cxx
# Opt level: O3

char * __thiscall cmCTestGenericHandler::GetOption(cmCTestGenericHandler *this,string *op)

{
  iterator iVar1;
  char *pcVar2;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->Options)._M_t,op);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->Options)._M_t._M_impl.super__Rb_tree_header) {
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar2 = *(char **)(iVar1._M_node + 2);
  }
  return pcVar2;
}

Assistant:

const char* cmCTestGenericHandler::GetOption(const std::string& op)
{
  cmCTestGenericHandler::t_StringToString::iterator remit =
    this->Options.find(op);
  if (remit == this->Options.end()) {
    return nullptr;
  }
  return remit->second.c_str();
}